

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffdstr(fitsfile *fptr,char *string,int *status)

{
  int iVar1;
  size_t sVar2;
  int *in_RDX;
  undefined8 in_RSI;
  bool bVar3;
  char nextcomm [73];
  char message [81];
  char card [81];
  char value [71];
  char comm [73];
  char valstring [71];
  int len;
  int keypos;
  int *in_stack_fffffffffffffdd8;
  int *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  fitsfile *in_stack_fffffffffffffdf8;
  char local_1d8 [40];
  int *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  int *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  fitsfile *in_stack_fffffffffffffe88;
  char local_118 [48];
  int *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff24;
  fitsfile *in_stack_ffffffffffffff28;
  int local_28;
  int local_4;
  
  if (*in_RDX < 1) {
    iVar1 = ffgstr(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                   in_stack_fffffffffffffde0);
    if (iVar1 < 1) {
      ffdrec(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18);
      ffpsvc(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe50);
      if (*in_RDX < 1) {
        ffpmrk();
        ffc2s(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8)
        ;
        if (*in_RDX == 0xcc) {
          ffcmrk();
          *in_RDX = 0;
        }
        else {
          sVar2 = strlen(local_118);
          local_28 = (int)sVar2;
          while( true ) {
            bVar3 = false;
            if (local_28 != 0) {
              bVar3 = local_118[local_28 + -1] == '&';
            }
            if (!bVar3) break;
            ffgcnt(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                   in_stack_fffffffffffffe70);
            if (local_118[0] == '\0') {
              local_28 = 0;
            }
            else {
              ffdrec(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18);
              sVar2 = strlen(local_118);
              local_28 = (int)sVar2;
            }
          }
        }
        local_4 = *in_RDX;
      }
      else {
        local_4 = *in_RDX;
      }
    }
    else {
      snprintf(local_1d8,0x51,"Could not find the %s keyword to delete (ffdkey)",in_RSI);
      ffpmsg((char *)0x224d06);
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffdstr(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *string,     /* I - keyword name       */
           int *status)       /* IO - error status      */
/*
  delete a specified header keyword containing the input string
*/
{
    int keypos, len;
    char valstring[FLEN_VALUE], comm[FLEN_COMMENT], value[FLEN_VALUE];
    char card[FLEN_CARD], message[FLEN_ERRMSG], nextcomm[FLEN_COMMENT];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgstr(fptr, string, card, status) > 0) /* read keyword */
    {
        snprintf(message, FLEN_ERRMSG,"Could not find the %s keyword to delete (ffdkey)",
                string);
        ffpmsg(message);
        return(*status);
    }

    /* calc position of keyword in header */
    keypos = (int) ((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80);

    ffdrec(fptr, keypos, status);  /* delete the keyword */

    /* check for string value which may be continued over multiple keywords */
    ffpsvc(card, valstring, comm, status);

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check for string value which may be continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(valstring, value, status);   /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
 
      len = strlen(value);

      while (len && value[len - 1] == '&')  /* ampersand used as continuation char */
      {
        ffgcnt(fptr, value, nextcomm, status);
        if (*value)
        {
            ffdrec(fptr, keypos, status);  /* delete the keyword */
            len = strlen(value);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}